

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O0

tool_var * varcontent(GlobalConfig *global,char *name,size_t nlen)

{
  int iVar1;
  size_t sVar2;
  tool_var *local_30;
  tool_var *list;
  size_t nlen_local;
  char *name_local;
  GlobalConfig *global_local;
  
  local_30 = global->variables;
  while( true ) {
    if (local_30 == (tool_var *)0x0) {
      return (tool_var *)0x0;
    }
    sVar2 = strlen(local_30->name);
    if ((sVar2 == nlen) && (iVar1 = strncmp(name,local_30->name,nlen), iVar1 == 0)) break;
    local_30 = local_30->next;
  }
  return local_30;
}

Assistant:

static const struct tool_var *varcontent(struct GlobalConfig *global,
                                         const char *name, size_t nlen)
{
  struct tool_var *list = global->variables;
  while(list) {
    if((strlen(list->name) == nlen) &&
       !strncmp(name, list->name, nlen)) {
      return list;
    }
    list = list->next;
  }
  return NULL;
}